

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_store_scalar_null(Parser *this,char *str)

{
  char *pcVar1;
  pfn_error p_Var2;
  code *pcVar3;
  Location LVar4;
  bool bVar5;
  csubstr cVar6;
  char *pcStack_68;
  size_t local_60;
  char msg [59];
  
  pcVar1 = (this->m_buf).str;
  if ((str < pcVar1) || (pcVar1 + (this->m_buf).len < str)) {
    builtin_strncpy(msg + 0x30,"buf.end())",0xb);
    builtin_strncpy(msg + 0x20,"n() && str <= m_",0x10);
    builtin_strncpy(msg + 0x10,"tr >= m_buf.begi",0x10);
    builtin_strncpy(msg,"check failed: (s",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    p_Var2 = (this->m_stack).m_callbacks.m_error;
    cVar6 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_60 = cVar6.len;
    pcStack_68 = cVar6.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x5e97) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x5e97) << 0x40,8);
    LVar4.name.str = pcStack_68;
    LVar4.name.len = local_60;
    (*p_Var2)(msg,0x3b,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  _store_scalar(this,(csubstr)ZEXT816(0),0);
  return;
}

Assistant:

inline void      _store_scalar_null(const char *str) {  _RYML_CB_ASSERT(m_stack.m_callbacks, str >= m_buf.begin() && str <= m_buf.end()); _store_scalar({nullptr, size_t(0)}, false); }